

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O0

void __thiscall PDFTextString::PDFTextString(PDFTextString *this,string *inString)

{
  string *inString_local;
  PDFTextString *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)inString);
  return;
}

Assistant:

PDFTextString::PDFTextString(const std::string& inString)
{
	mTextString = inString;
}